

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)47,_(unsigned_short)29>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  puVar2 = *in;
  uVar1 = *puVar2;
  out[0x1d] = (ulong)(uVar1 >> 0x13);
  *in = puVar2 + 1;
  uVar3 = (ulong)puVar2[1] << 0xd | (ulong)(uVar1 >> 0x13);
  out[0x1d] = uVar3;
  *in = puVar2 + 2;
  uVar1 = puVar2[2];
  out[0x1d] = (ulong)(uVar1 & 3) << 0x2d | uVar3;
  uVar3 = (ulong)(uVar1 >> 2);
  out[0x1e] = uVar3;
  *in = puVar2 + 3;
  uVar1 = puVar2[3];
  out[0x1e] = (ulong)(uVar1 & 0x1ffff) << 0x1e | uVar3;
  uVar3 = (ulong)(uVar1 >> 0x11);
  out[0x1f] = uVar3;
  out[0x1f] = (ulong)puVar2[4] << 0xf | uVar3;
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}